

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * __thiscall
units::probeUnit_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  char *pcVar1;
  ulong uVar2;
  unit un_00;
  unit un_01;
  unit un_02;
  unit un_03;
  precise_unit pVar3;
  allocator local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  precise_unit local_1e0;
  unit local_1d0;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  unit local_188;
  string local_180;
  double local_160;
  undefined8 uStack_158;
  allocator local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  precise_unit local_c8;
  unit local_b8;
  string local_b0;
  undefined4 local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  unit local_60;
  undefined1 local_58 [8];
  string fnd;
  precise_unit ext;
  pair<units::precise_unit,_const_char_*> *probe_local;
  precise_unit *un_local;
  
  pVar3 = precise_unit::operator*((precise_unit *)this,un);
  fnd.field_2._8_8_ = pVar3.multiplier_;
  local_60 = unit_cast((precise_unit *)((long)&fnd.field_2 + 8));
  find_unit_abi_cxx11_((string *)local_58,(units *)local_60,un_00);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,'/'
                  );
    std::operator+(__return_storage_ptr__,&local_80,(char *)un[1].multiplier_);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    pVar3 = precise_unit::inv((precise_unit *)((long)&fnd.field_2 + 8));
    local_c8._8_8_ = pVar3._8_8_;
    local_c8.multiplier_ = pVar3.multiplier_;
    local_b8 = unit_cast(&local_c8);
    find_unit_abi_cxx11_(&local_b0,(units *)local_b8,un_01);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"1/(",&local_149);
      std::operator+(&local_128,&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_108,&local_128,'*');
      std::operator+(&local_e8,&local_108,(char *)un[1].multiplier_);
      std::operator+(__return_storage_ptr__,&local_e8,')');
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    else {
      pVar3 = precise_unit::operator/((precise_unit *)this,un);
      uStack_158 = pVar3._8_8_;
      local_160 = pVar3.multiplier_;
      fnd.field_2._8_8_ = local_160;
      local_188 = unit_cast((precise_unit *)((long)&fnd.field_2 + 8));
      find_unit_abi_cxx11_(&local_180,(units *)local_188,un_02);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+(&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,'*');
        std::operator+(__return_storage_ptr__,&local_1a8,(char *)un[1].multiplier_);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        pVar3 = precise_unit::inv((precise_unit *)((long)&fnd.field_2 + 8));
        local_1e0._8_8_ = pVar3._8_8_;
        local_1e0.multiplier_ = pVar3.multiplier_;
        local_1d0 = unit_cast(&local_1e0);
        find_unit_abi_cxx11_(&local_1c8,(units *)local_1d0,un_03);
        std::__cxx11::string::operator=((string *)local_58,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          pcVar1 = (char *)un[1].multiplier_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_220,pcVar1,&local_221);
          std::operator+(&local_200,&local_220,'/');
          std::operator+(__return_storage_ptr__,&local_200,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator((allocator<char> *)&local_221);
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__);
        }
      }
    }
  }
  local_90 = 1;
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

static std::string probeUnit(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    // let's try common divisor units
    auto ext = un * probe.first;
    auto fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '/' + probe.second;
    }
    // let's try inverse of common multiplier units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string("1/(") + fnd + '*' + probe.second + ')';
    }

    // let's try common multiplier units
    ext = un / probe.first;
    fnd = find_unit(unit_cast(ext));
    if (!fnd.empty()) {
        return fnd + '*' + probe.second;
    }
    // let's try common divisor with inv units
    fnd = find_unit(unit_cast(ext.inv()));
    if (!fnd.empty()) {
        return std::string(probe.second) + '/' + fnd;
    }
    return std::string{};
}